

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O2

void __thiscall
license::EventRegistry::exportLastEvents(EventRegistry *this,AuditEvent *auditEvents,int nlogs)

{
  pointer __src;
  int iVar1;
  
  __src = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar1 = (int)(((long)(this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)__src) / 0x208);
  if (iVar1 < nlogs) {
    nlogs = iVar1;
  }
  if (nlogs != 0) {
    memmove(auditEvents,__src,(long)nlogs * 0x208);
    return;
  }
  return;
}

Assistant:

void EventRegistry::exportLastEvents(AuditEvent* auditEvents, int nlogs) {
	int sizeToCopy = min(nlogs, (int) logs.size());
	std::copy(logs.begin(), logs.begin() + sizeToCopy, auditEvents);
}